

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O3

void __thiscall FTextureManager::DeleteAll(FTextureManager *this)

{
  long *plVar1;
  FAnimDef *block;
  FSwitchDef *block_00;
  void *pvVar2;
  uchar *puVar3;
  uint uVar4;
  FDoorAnimation *pFVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = (this->Textures).Count;
  if (uVar4 != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      plVar1 = *(long **)((long)&((this->Textures).Array)->Texture + lVar6);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        uVar4 = (this->Textures).Count;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < uVar4);
    if (uVar4 != 0) {
      (this->Textures).Count = 0;
    }
  }
  if ((this->Translation).Count != 0) {
    (this->Translation).Count = 0;
  }
  if ((this->FirstTextureForFile).Count != 0) {
    (this->FirstTextureForFile).Count = 0;
  }
  memset(this->HashFirst,0xff,0x1010);
  uVar4 = (this->mAnimations).Count;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      block = (this->mAnimations).Array[uVar7];
      if (block != (FAnimDef *)0x0) {
        M_Free(block);
        (this->mAnimations).Array[uVar7] = (FAnimDef *)0x0;
        uVar4 = (this->mAnimations).Count;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
    if (uVar4 != 0) {
      (this->mAnimations).Count = 0;
    }
  }
  uVar4 = (this->mSwitchDefs).Count;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      block_00 = (this->mSwitchDefs).Array[uVar7];
      if (block_00 != (FSwitchDef *)0x0) {
        M_Free(block_00);
        (this->mSwitchDefs).Array[uVar7] = (FSwitchDef *)0x0;
        uVar4 = (this->mSwitchDefs).Count;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
    if (uVar4 != 0) {
      (this->mSwitchDefs).Count = 0;
    }
  }
  uVar4 = (this->mAnimatedDoors).Count;
  if (uVar4 != 0) {
    pFVar5 = (this->mAnimatedDoors).Array;
    lVar6 = 8;
    uVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&(pFVar5->BaseTexture).texnum + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
        pFVar5 = (this->mAnimatedDoors).Array;
        *(undefined8 *)((long)&(pFVar5->BaseTexture).texnum + lVar6) = 0;
        uVar4 = (this->mAnimatedDoors).Count;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < uVar4);
    if (uVar4 != 0) {
      (this->mAnimatedDoors).Count = 0;
    }
  }
  uVar4 = (this->BuildTileFiles).Count;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      puVar3 = (this->BuildTileFiles).Array[uVar7];
      if (puVar3 != (uchar *)0x0) {
        operator_delete__(puVar3);
        uVar4 = (this->BuildTileFiles).Count;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
    if (uVar4 != 0) {
      (this->BuildTileFiles).Count = 0;
    }
  }
  return;
}

Assistant:

void FTextureManager::DeleteAll()
{
	for (unsigned int i = 0; i < Textures.Size(); ++i)
	{
		delete Textures[i].Texture;
	}
	Textures.Clear();
	Translation.Clear();
	FirstTextureForFile.Clear();
	memset (HashFirst, -1, sizeof(HashFirst));
	DefaultTexture.SetInvalid();

	for (unsigned i = 0; i < mAnimations.Size(); i++)
	{
		if (mAnimations[i] != NULL)
		{
			M_Free (mAnimations[i]);
			mAnimations[i] = NULL;
		}
	}
	mAnimations.Clear();

	for (unsigned i = 0; i < mSwitchDefs.Size(); i++)
	{
		if (mSwitchDefs[i] != NULL)
		{
			M_Free (mSwitchDefs[i]);
			mSwitchDefs[i] = NULL;
		}
	}
	mSwitchDefs.Clear();

	for (unsigned i = 0; i < mAnimatedDoors.Size(); i++)
	{
		if (mAnimatedDoors[i].TextureFrames != NULL)
		{
			delete[] mAnimatedDoors[i].TextureFrames;
			mAnimatedDoors[i].TextureFrames = NULL;
		}
	}
	mAnimatedDoors.Clear();

	for (unsigned int i = 0; i < BuildTileFiles.Size(); ++i)
	{
		delete[] BuildTileFiles[i];
	}
	BuildTileFiles.Clear();
}